

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::StandardPropertyCaseItemSyntax::StandardPropertyCaseItemSyntax
          (StandardPropertyCaseItemSyntax *this,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *expressions,Token colon,
          PropertyExprSyntax *expr,Token semi)

{
  size_type sVar1;
  SyntaxKind SVar2;
  undefined4 uVar3;
  ExpressionSyntax *pEVar4;
  PropertyExprSyntax *pPVar5;
  undefined8 uVar6;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  iterator_base<slang::syntax::ExpressionSyntax_*> local_38;
  
  uVar6 = colon._0_8_;
  (this->super_PropertyCaseItemSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_PropertyCaseItemSyntax).super_SyntaxNode.kind = StandardPropertyCaseItem;
  SVar2 = (expressions->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar3 = *(undefined4 *)&(expressions->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent =
       (expressions->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.kind = SVar2;
  *(undefined4 *)&(this->expressions).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar3;
  (this->expressions).super_SyntaxListBase.childCount =
       (expressions->super_SyntaxListBase).childCount;
  (this->expressions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_004730a0;
  sVar1 = (expressions->elements).size_;
  (this->expressions).elements.data_ = (expressions->elements).data_;
  (this->expressions).elements.size_ = sVar1;
  (this->colon).kind = (short)uVar6;
  (this->colon).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->colon).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->colon).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->colon).info = colon.info;
  local_38.list = (ParentList *)expr;
  not_null<slang::syntax::PropertyExprSyntax*>::not_null<slang::syntax::PropertyExprSyntax*,void>
            ((not_null<slang::syntax::PropertyExprSyntax*> *)&this->expr,
             (PropertyExprSyntax **)&local_38);
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  local_38.index = 0;
  sVar1 = (this->expressions).elements.size_;
  local_38.list = &this->expressions;
  for (; (local_38.list != &this->expressions || (local_38.index != sVar1 + 1 >> 1));
      local_38.index = local_38.index + 1) {
    pEVar4 = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
             iterator_base<slang::syntax::ExpressionSyntax_*>::operator*(&local_38);
    (pEVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  pPVar5 = not_null<slang::syntax::PropertyExprSyntax_*>::get(&this->expr);
  (pPVar5->super_SyntaxNode).parent = (SyntaxNode *)this;
  return;
}

Assistant:

StandardPropertyCaseItemSyntax(const SeparatedSyntaxList<ExpressionSyntax>& expressions, Token colon, PropertyExprSyntax& expr, Token semi) :
        PropertyCaseItemSyntax(SyntaxKind::StandardPropertyCaseItem), expressions(expressions), colon(colon), expr(&expr), semi(semi) {
        this->expressions.parent = this;
        for (auto child : this->expressions)
            child->parent = this;
        this->expr->parent = this;
    }